

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::CopyFrom(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *mat)

{
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  undefined1 local_48 [24];
  
  lVar3 = (mat->super_TPZBaseMatrix).fRow;
  lVar1 = (mat->super_TPZBaseMatrix).fCol;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,lVar3,lVar1);
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  if (lVar3 < 1) {
    lVar3 = lVar2;
  }
  for (; lVar2 != lVar3; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(mat,lVar2,lVar4);
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(this,lVar2,lVar4,local_48);
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::CopyFrom(const TPZMatrix<TVar> *mat)
{
    const auto r = mat->Rows();
    const auto c = mat->Cols();
    this->Resize(r,c);
    for(auto i = 0 ;i < r;i++){
        for(auto j = 0; j < c; j++){
            this->PutVal(i,j,mat->GetVal(i,j));
        }
    }
}